

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int32_helper.c
# Opt level: O3

void leon3_irq_manager_sparc(CPUSPARCState *env,void *irq_manager,int intno)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = env->cache_control;
  if ((uVar1 & 0x10) != 0) {
    uVar3 = 1;
    if ((uVar1 & 3) != 3) {
      uVar3 = uVar1 & 3;
    }
    uVar1 = uVar1 & 0xfffffffc | uVar3;
    env->cache_control = uVar1;
  }
  if ((uVar1 & 0x20) != 0) {
    uVar2 = uVar1 >> 2 & 3;
    uVar3 = 4;
    if (uVar2 != 3) {
      uVar3 = uVar2 * 4;
    }
    env->cache_control = uVar3 | uVar1 & 0xfffffff3;
  }
  return;
}

Assistant:

static void leon3_cache_control_int(CPUSPARCState *env)
{
    uint32_t state = 0;

    if (env->cache_control & CACHE_CTRL_IF) {
        /* Instruction cache state */
        state = env->cache_control & CACHE_STATE_MASK;
        if (state == CACHE_ENABLED) {
            state = CACHE_FROZEN;
        }

        env->cache_control &= ~CACHE_STATE_MASK;
        env->cache_control |= state;
    }

    if (env->cache_control & CACHE_CTRL_DF) {
        /* Data cache state */
        state = (env->cache_control >> 2) & CACHE_STATE_MASK;
        if (state == CACHE_ENABLED) {
            state = CACHE_FROZEN;
        }

        env->cache_control &= ~(CACHE_STATE_MASK << 2);
        env->cache_control |= (state << 2);
    }
}